

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O2

String * __thiscall asl::String::operator=(String *this,wchar_t **x)

{
  String s;
  String SStack_28;
  
  String(&SStack_28,*x);
  operator=(this,&SStack_28);
  ~String(&SStack_28);
  return this;
}

Assistant:

String& operator=(const T& x) { String s=x; *this = s; return *this; }